

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::ChooseRenderPassAndFramebuffer(DeviceContextVkImpl *this)

{
  RefCntAutoPtr<Diligent::ITextureView> *this_00;
  ITexture *pIVar1;
  RenderDeviceVkImpl *pRVar2;
  FramebufferCache *this_01;
  RenderPassCache *this_02;
  ITextureView *pIVar3;
  RenderingInfoWrapper *pRVar4;
  undefined8 __p;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureViewVkImpl *pTVar7;
  RenderPassVkImpl *pRVar8;
  VkFramebuffer pVVar9;
  undefined4 extraout_var_03;
  TextureFormatAttribs *pTVar10;
  undefined4 extraout_var_04;
  long lVar11;
  Uint32 rt;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  string msg;
  RenderPassCacheKey local_108;
  CreateDyanmicRenderInfoAttribs local_e0;
  undefined1 local_c0 [48];
  VkImageView_T *local_90;
  VkImageView pVStack_88;
  __node_base local_80;
  size_type sStack_78;
  _Prime_rehash_policy local_70;
  __node_base_ptr local_60;
  __buckets_ptr pp_Stack_58;
  size_type local_50;
  __node_base _Stack_48;
  size_type local_40;
  undefined8 uStack_38;
  
  local_c0._32_8_ = (__pthread_internal_list *)0x0;
  pVStack_88 = (VkImageView)0x0;
  local_80._M_nxt = (_Hash_node_base *)0x0;
  sStack_78 = 0;
  local_70._M_max_load_factor = 0.0;
  local_70._4_4_ = 0;
  local_70._M_next_resize = 0;
  local_60 = (__node_base_ptr)0x0;
  pp_Stack_58 = (__buckets_ptr)0x0;
  local_108.Hash = 0;
  local_108.SampleCount = '\0';
  local_108.EnableVRS = false;
  local_108.ReadOnlyDSV = false;
  local_108.DSVFormat = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[0] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[1] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[2] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[3] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[4] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[5] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[6] = TEX_FORMAT_UNKNOWN;
  local_108.RTVFormats[7] = TEX_FORMAT_UNKNOWN;
  local_50 = 0;
  _Stack_48._M_nxt = (_Hash_node_base *)0x0;
  local_40 = 0;
  uStack_38._0_4_ = 0.0;
  uStack_38._4_4_ = 0;
  pTVar7 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
  if (pTVar7 == (TextureViewVkImpl *)0x0) {
    local_90 = (VkImageView_T *)0x0;
    bVar13 = 0;
  }
  else {
    local_90 = (pTVar7->m_ImageView).m_VkObject;
    local_108._0_8_ =
         (ulong)CONCAT21((pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.Format,
                         (pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                         .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL) << 0x18;
    iVar5 = (*(((pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
              super_IDeviceObject).super_IObject._vptr_IObject[4])();
    bVar13 = *(byte *)(CONCAT44(extraout_var,iVar5) + 0x20);
    local_108.SampleCount = bVar13;
  }
  uVar6 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  local_108.NumRenderTargets = (Uint8)uVar6;
  local_c0._40_4_ = uVar6;
  for (uVar12 = 0; uVar12 < uVar6; uVar12 = uVar12 + 1) {
    pTVar7 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets[uVar12].
             m_pObject;
    if (pTVar7 == (TextureViewVkImpl *)0x0) {
      (&pVStack_88)[uVar12] = (VkImageView)0x0;
      local_108.RTVFormats[uVar12] = TEX_FORMAT_UNKNOWN;
    }
    else {
      pIVar1 = (pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture;
      (&pVStack_88)[uVar12] = (pTVar7->m_ImageView).m_VkObject;
      iVar5 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
      local_108.RTVFormats[uVar12] = *(TEXTURE_FORMAT *)(CONCAT44(extraout_var_00,iVar5) + 0x18);
      if (bVar13 == 0) {
        iVar5 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
        bVar13 = *(byte *)(CONCAT44(extraout_var_02,iVar5) + 0x20);
        local_108.SampleCount = bVar13;
      }
      else {
        iVar5 = (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar1);
        if (*(uint *)(CONCAT44(extraout_var_01,iVar5) + 0x20) != (uint)bVar13) {
          FormatString<char[26]>((string *)local_c0,(char (*) [26])"Inconsistent sample count");
          DebugAssertionFailed
                    ((Char *)local_c0._0_8_,"ChooseRenderPassAndFramebuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x767);
          std::__cxx11::string::~string((string *)local_c0);
        }
      }
    }
    uVar6 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
  }
  if (bVar13 == 0) {
    local_108.SampleCount =
         (Uint8)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSamples;
  }
  this_00 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap;
  bVar14 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap.m_pObject ==
           (ITextureView *)0x0;
  if (bVar14) {
    _Stack_48._M_nxt = (_Hash_node_base *)0x0;
  }
  else {
    pTVar7 = RefCntAutoPtr<Diligent::ITextureView>::RawPtr<Diligent::TextureViewVkImpl>(this_00);
    _Stack_48._M_nxt = (_Hash_node_base *)(pTVar7->m_ImageView).m_VkObject;
  }
  local_108.EnableVRS = !bVar14;
  pRVar2 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  this_01 = (pRVar2->m_FramebufferCache)._M_t.
            super___uniq_ptr_impl<Diligent::FramebufferCache,_std::default_delete<Diligent::FramebufferCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::FramebufferCache_*,_std::default_delete<Diligent::FramebufferCache>_>
            .super__Head_base<0UL,_Diligent::FramebufferCache_*,_false>._M_head_impl;
  this_02 = (pRVar2->m_ImplicitRenderPassCache)._M_t.
            super___uniq_ptr_impl<Diligent::RenderPassCache,_std::default_delete<Diligent::RenderPassCache>_>
            ._M_t.
            super__Tuple_impl<0UL,_Diligent::RenderPassCache_*,_std::default_delete<Diligent::RenderPassCache>_>
            .super__Head_base<0UL,_Diligent::RenderPassCache_*,_false>._M_head_impl;
  if (this_02 == (RenderPassCache *)0x0 || this_01 == (FramebufferCache *)0x0) {
    local_e0.UseDepthAttachment = false;
    local_e0.UseStencilAttachment = false;
    local_e0.ReadOnlyDepthStencil = false;
    local_e0.ShadingRateTexelSize.width = 0;
    local_e0.ShadingRateTexelSize.height = 0;
    local_e0.Extent.width =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth;
    local_e0.Extent.height =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight;
    local_e0.Layers =
         (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices;
    local_e0.ViewMask = 0;
    pTVar7 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject;
    bVar14 = pTVar7 != (TextureViewVkImpl *)0x0;
    if (bVar14) {
      iVar5 = (*(((pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pTexture)->
                super_IDeviceObject).super_IObject._vptr_IObject[4])();
      pTVar10 = GetTextureFormatAttribs(*(TEXTURE_FORMAT *)(CONCAT44(extraout_var_03,iVar5) + 0x18))
      ;
      local_e0.UseStencilAttachment = pTVar10->ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
      local_e0.ReadOnlyDepthStencil =
           (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil.m_pObject)->
           super_TextureViewBase<Diligent::EngineVkImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
           .m_Desc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
    }
    pIVar3 = this_00->m_pObject;
    local_e0.UseDepthAttachment = bVar14;
    if (pIVar3 != (ITextureView *)0x0) {
      iVar5 = (*(pIVar3->super_IDeviceObject).super_IObject._vptr_IObject[10])();
      lVar11 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x20))
                         ((long *)CONCAT44(extraout_var_04,iVar5));
      local_e0.ShadingRateTexelSize.width =
           AlignUpToPowerOfTwo<unsigned_int>
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth /
                      *(uint *)(lVar11 + 0xc));
      local_e0.ShadingRateTexelSize.height =
           AlignUpToPowerOfTwo<unsigned_int>
                     ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight /
                      *(uint *)(lVar11 + 0x10));
    }
    pRVar4 = (this->m_DynamicRenderingInfo)._M_t.
             super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
    if ((pRVar4 != (RenderingInfoWrapper *)0x0) && (pRVar4->m_AttachmentClearMask != 0)) {
      FormatString<char[52]>
                ((string *)local_c0,
                 (char (*) [52])"There are pending clears in the dynamic render pass");
      DebugAssertionFailed
                ((Char *)local_c0._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x7aa);
      std::__cxx11::string::~string((string *)local_c0);
    }
    FramebufferCache::CreateDyanmicRenderInfo
              ((FramebufferCache *)local_c0,(FramebufferCacheKey *)(local_c0 + 0x20),&local_e0);
    __p = local_c0._0_8_;
    local_c0._0_8_ = (pointer)0x0;
    std::
    __uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ::reset((__uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
             *)&this->m_DynamicRenderingInfo,(pointer)__p);
    std::
    unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
    ::~unique_ptr((unique_ptr<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
                   *)local_c0);
  }
  else {
    pRVar8 = RenderPassCache::GetRenderPass(this_02,&local_108);
    if (pRVar8 == (RenderPassVkImpl *)0x0) {
      FormatString<char[65]>
                ((string *)local_c0,
                 (char (*) [65])"Unable to get render pass for the currently bound render targets");
      DebugAssertionFailed
                ((Char *)local_c0._0_8_,"ChooseRenderPassAndFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x78b);
      std::__cxx11::string::~string((string *)local_c0);
      this->m_vkRenderPass = (VkRenderPass)0x0;
      this->m_vkFramebuffer = (VkFramebuffer)0x0;
    }
    else {
      local_c0._32_8_ = (pRVar8->m_VkRenderPass).m_VkObject;
      this->m_vkRenderPass = (VkRenderPass)local_c0._32_8_;
      local_40 = 0xffffffffffffffff;
      pVVar9 = FramebufferCache::GetFramebuffer
                         (this_01,(FramebufferCacheKey *)(local_c0 + 0x20),
                          (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferWidth,
                          (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferHeight,
                          (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_FramebufferSlices)
      ;
      this->m_vkFramebuffer = pVVar9;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::ChooseRenderPassAndFramebuffer()
{
    FramebufferCache::FramebufferCacheKey FBKey;
    RenderPassCache::RenderPassCacheKey   RenderPassKey;
    if (m_pBoundDepthStencil)
    {
        ITexture* pDepthBuffer    = m_pBoundDepthStencil->GetTexture();
        FBKey.DSV                 = m_pBoundDepthStencil->GetVulkanImageView();
        RenderPassKey.DSVFormat   = m_pBoundDepthStencil->GetDesc().Format;
        RenderPassKey.ReadOnlyDSV = m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
        RenderPassKey.SampleCount = static_cast<Uint8>(pDepthBuffer->GetDesc().SampleCount);
    }
    else
    {
        FBKey.DSV               = VK_NULL_HANDLE;
        RenderPassKey.DSVFormat = TEX_FORMAT_UNKNOWN;
    }

    FBKey.NumRenderTargets         = m_NumBoundRenderTargets;
    RenderPassKey.NumRenderTargets = static_cast<Uint8>(m_NumBoundRenderTargets);

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewVkImpl* pRTVVk = m_pBoundRenderTargets[rt])
        {
            ITexture* pRenderTarget      = pRTVVk->GetTexture();
            FBKey.RTVs[rt]               = pRTVVk->GetVulkanImageView();
            RenderPassKey.RTVFormats[rt] = pRenderTarget->GetDesc().Format;
            if (RenderPassKey.SampleCount == 0)
                RenderPassKey.SampleCount = static_cast<Uint8>(pRenderTarget->GetDesc().SampleCount);
            else
                VERIFY(RenderPassKey.SampleCount == pRenderTarget->GetDesc().SampleCount, "Inconsistent sample count");
        }
        else
        {
            FBKey.RTVs[rt]               = VK_NULL_HANDLE;
            RenderPassKey.RTVFormats[rt] = TEX_FORMAT_UNKNOWN;
        }
    }

    if (RenderPassKey.SampleCount == 0)
        RenderPassKey.SampleCount = static_cast<Uint8>(m_FramebufferSamples);

    if (m_pBoundShadingRateMap)
    {
        FBKey.ShadingRate       = m_pBoundShadingRateMap.RawPtr<TextureViewVkImpl>()->GetVulkanImageView();
        RenderPassKey.EnableVRS = true;
    }
    else
    {
        FBKey.ShadingRate       = VK_NULL_HANDLE;
        RenderPassKey.EnableVRS = false;
    }

    FramebufferCache* FBCache = m_pDevice->GetFramebufferCache();
    RenderPassCache*  RPCache = m_pDevice->GetImplicitRenderPassCache();
    if (FBCache != nullptr && RPCache != nullptr)
    {
        if (RenderPassVkImpl* pRenderPass = RPCache->GetRenderPass(RenderPassKey))
        {
            m_vkRenderPass         = pRenderPass->GetVkRenderPass();
            FBKey.Pass             = m_vkRenderPass;
            FBKey.CommandQueueMask = ~Uint64{0};
            m_vkFramebuffer        = FBCache->GetFramebuffer(FBKey, m_FramebufferWidth, m_FramebufferHeight, m_FramebufferSlices);
        }
        else
        {
            UNEXPECTED("Unable to get render pass for the currently bound render targets");
            m_vkRenderPass  = VK_NULL_HANDLE;
            m_vkFramebuffer = VK_NULL_HANDLE;
        }
    }
    else
    {
        FramebufferCache::CreateDyanmicRenderInfoAttribs CreateRIAttribs;
        CreateRIAttribs.Extent   = {m_FramebufferWidth, m_FramebufferHeight};
        CreateRIAttribs.Layers   = m_FramebufferSlices;
        CreateRIAttribs.ViewMask = 0;
        if (m_pBoundDepthStencil)
        {
            const TEXTURE_FORMAT        DepthStencilFmt = m_pBoundDepthStencil->GetTexture()->GetDesc().Format;
            const TextureFormatAttribs& FmtAttribs      = GetTextureFormatAttribs(DepthStencilFmt);

            CreateRIAttribs.UseDepthAttachment   = true;
            CreateRIAttribs.UseStencilAttachment = FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL;
            CreateRIAttribs.ReadOnlyDepthStencil = (m_pBoundDepthStencil->GetDesc().ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        }
        if (m_pBoundShadingRateMap)
        {
            const TextureDesc& ShadingRateDesc = m_pBoundShadingRateMap->GetTexture()->GetDesc();
            // Framebuffer size may not be an integer multiple of the shading rate texel size
            // Shading rate texel size be a power of two
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06149
            //   https://registry.khronos.org/vulkan/specs/latest/man/html/VkRenderingFragmentShadingRateAttachmentInfoKHR.html#VUID-VkRenderingFragmentShadingRateAttachmentInfoKHR-imageView-06152
            CreateRIAttribs.ShadingRateTexelSize.width  = AlignUpToPowerOfTwo(m_FramebufferWidth / ShadingRateDesc.Width);
            CreateRIAttribs.ShadingRateTexelSize.height = AlignUpToPowerOfTwo(m_FramebufferHeight / ShadingRateDesc.Height);
        }

        VERIFY(!m_DynamicRenderingInfo || !m_DynamicRenderingInfo->HasClears(), "There are pending clears in the dynamic render pass");
        m_DynamicRenderingInfo = FramebufferCache::CreateDyanmicRenderInfo(FBKey, CreateRIAttribs);
    }
}